

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::dump_escaped(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *this,string_t *s,bool ensure_ascii)

{
  value_type_conflict vVar1;
  ulong uVar2;
  uint8_t uVar3;
  ulong uVar4;
  byte *pbVar5;
  pointer pvVar6;
  size_type sVar7;
  element_type *peVar8;
  char *pcVar9;
  size_t sVar10;
  unsigned_long __val;
  value_type_conflict *pvVar11;
  reference pvVar12;
  undefined8 uVar13;
  byte in_DL;
  ulong in_RSI;
  long in_RDI;
  string sn_1;
  string sn;
  uint8_t byte;
  size_t i;
  size_t bytes;
  uint8_t state;
  uint32_t codepoint;
  uint32_t *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  allocator *paVar14;
  string *in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffedc;
  allocator local_119;
  string local_118 [39];
  undefined1 local_f1;
  allocator local_59;
  string local_58 [39];
  byte local_31;
  ulong local_30;
  long local_28;
  char local_19;
  uint local_18;
  byte local_11;
  ulong local_10;
  
  local_11 = in_DL & 1;
  local_19 = '\0';
  local_28 = 0;
  local_30 = 0;
  local_10 = in_RSI;
  do {
    uVar2 = local_30;
    uVar4 = std::__cxx11::string::size();
    if (uVar4 <= uVar2) {
      if (local_19 == '\0') {
        if (local_28 != 0) {
          peVar8 = std::
                   __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x264c50);
          pvVar6 = std::array<char,_512UL>::data((array<char,_512UL> *)0x264c63);
          (*peVar8->_vptr_output_adapter_protocol[1])(peVar8,pvVar6,local_28);
        }
        return;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_118,3,'\0',&local_119);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
      pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)local_118);
      sVar10 = std::__cxx11::string::size();
      pbVar5 = (byte *)std::__cxx11::string::back();
      snprintf(pcVar9,sVar10,"%.2X",(ulong)*pbVar5);
      uVar13 = __cxa_allocate_exception(0x20);
      std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      type_error::create(in_stack_fffffffffffffedc,in_stack_fffffffffffffed0);
      __cxa_throw(uVar13,&type_error::typeinfo,type_error::~type_error);
    }
    pbVar5 = (byte *)std::__cxx11::string::operator[](local_10);
    local_31 = *pbVar5;
    uVar3 = decode((uint8_t *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,'\0');
    if (uVar3 == '\0') {
      if (local_18 == 8) {
        local_28 = local_28 + 1;
        pvVar12 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe40,
                             (size_type)in_stack_fffffffffffffe38);
        *pvVar12 = '\\';
        local_28 = local_28 + 1;
        pvVar12 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe40,
                             (size_type)in_stack_fffffffffffffe38);
        *pvVar12 = 'b';
      }
      else if (local_18 == 9) {
        local_28 = local_28 + 1;
        pvVar12 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe40,
                             (size_type)in_stack_fffffffffffffe38);
        *pvVar12 = '\\';
        local_28 = local_28 + 1;
        pvVar12 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe40,
                             (size_type)in_stack_fffffffffffffe38);
        *pvVar12 = 't';
      }
      else if (local_18 == 10) {
        local_28 = local_28 + 1;
        pvVar12 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe40,
                             (size_type)in_stack_fffffffffffffe38);
        *pvVar12 = '\\';
        local_28 = local_28 + 1;
        pvVar12 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe40,
                             (size_type)in_stack_fffffffffffffe38);
        *pvVar12 = 'n';
      }
      else if (local_18 == 0xc) {
        local_28 = local_28 + 1;
        pvVar12 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe40,
                             (size_type)in_stack_fffffffffffffe38);
        *pvVar12 = '\\';
        local_28 = local_28 + 1;
        pvVar12 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe40,
                             (size_type)in_stack_fffffffffffffe38);
        *pvVar12 = 'f';
      }
      else if (local_18 == 0xd) {
        local_28 = local_28 + 1;
        pvVar12 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe40,
                             (size_type)in_stack_fffffffffffffe38);
        *pvVar12 = '\\';
        local_28 = local_28 + 1;
        pvVar12 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe40,
                             (size_type)in_stack_fffffffffffffe38);
        *pvVar12 = 'r';
      }
      else if (local_18 == 0x22) {
        local_28 = local_28 + 1;
        pvVar12 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe40,
                             (size_type)in_stack_fffffffffffffe38);
        *pvVar12 = '\\';
        local_28 = local_28 + 1;
        pvVar12 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe40,
                             (size_type)in_stack_fffffffffffffe38);
        *pvVar12 = '\"';
      }
      else if (local_18 == 0x5c) {
        local_28 = local_28 + 1;
        pvVar12 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe40,
                             (size_type)in_stack_fffffffffffffe38);
        *pvVar12 = '\\';
        local_28 = local_28 + 1;
        pvVar12 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe40,
                             (size_type)in_stack_fffffffffffffe38);
        *pvVar12 = '\\';
      }
      else if ((local_18 < 0x20) || (((local_11 & 1) != 0 && (0x7e < local_18)))) {
        if (local_18 < 0x10000) {
          pvVar6 = std::array<char,_512UL>::data((array<char,_512UL> *)0x264817);
          snprintf(pvVar6 + local_28,7,"\\u%04x",(ulong)(local_18 & 0xffff));
          local_28 = local_28 + 6;
        }
        else {
          pvVar6 = std::array<char,_512UL>::data((array<char,_512UL> *)0x264863);
          snprintf(pvVar6 + local_28,0xd,"\\u%04x\\u%04x",
                   (ulong)((local_18 >> 10) + 0xd7c0 & 0xffff),
                   (ulong)((local_18 & 0x3ff) + 0xdc00 & 0xffff));
          local_28 = local_28 + 0xc;
        }
      }
      else {
        pvVar11 = (value_type_conflict *)std::__cxx11::string::operator[](local_10);
        vVar1 = *pvVar11;
        local_28 = local_28 + 1;
        pvVar12 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe40,
                             (size_type)in_stack_fffffffffffffe38);
        *pvVar12 = vVar1;
      }
      sVar7 = std::array<char,_512UL>::size((array<char,_512UL> *)(in_RDI + 0x5a));
      if (sVar7 - local_28 < 0xd) {
        peVar8 = std::
                 __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x26492c);
        pvVar6 = std::array<char,_512UL>::data((array<char,_512UL> *)0x26493f);
        (*peVar8->_vptr_output_adapter_protocol[1])(peVar8,pvVar6,local_28);
        local_28 = 0;
      }
    }
    else {
      if (uVar3 == '\x01') {
        paVar14 = &local_59;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_58,3,'\0',paVar14);
        std::allocator<char>::~allocator((allocator<char> *)&local_59);
        pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
        sVar10 = std::__cxx11::string::size();
        snprintf(pcVar9,sVar10,"%.2X",(ulong)local_31);
        local_f1 = 1;
        __val = __cxa_allocate_exception(0x20);
        std::__cxx11::to_string(__val);
        std::operator+((char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
        std::operator+(in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
        std::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
        type_error::create(in_stack_fffffffffffffedc,in_stack_fffffffffffffed0);
        local_f1 = 0;
        __cxa_throw(__val,&type_error::typeinfo,type_error::~type_error);
      }
      if ((local_11 & 1) == 0) {
        pvVar11 = (value_type_conflict *)std::__cxx11::string::operator[](local_10);
        vVar1 = *pvVar11;
        local_28 = local_28 + 1;
        pvVar12 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffe40,
                             (size_type)in_stack_fffffffffffffe38);
        *pvVar12 = vVar1;
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void dump_escaped(const string_t& s, const bool ensure_ascii)
    {
        uint32_t codepoint;
        uint8_t state = UTF8_ACCEPT;
        std::size_t bytes = 0;  // number of bytes written to string_buffer

        for (std::size_t i = 0; i < s.size(); ++i)
        {
            const auto byte = static_cast<uint8_t>(s[i]);

            switch (decode(state, codepoint, byte))
            {
                case UTF8_ACCEPT:  // decode found a new code point
                {
                    switch (codepoint)
                    {
                        case 0x08: // backspace
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'b';
                            break;
                        }

                        case 0x09: // horizontal tab
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 't';
                            break;
                        }

                        case 0x0A: // newline
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'n';
                            break;
                        }

                        case 0x0C: // formfeed
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'f';
                            break;
                        }

                        case 0x0D: // carriage return
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'r';
                            break;
                        }

                        case 0x22: // quotation mark
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = '\"';
                            break;
                        }

                        case 0x5C: // reverse solidus
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = '\\';
                            break;
                        }

                        default:
                        {
                            // escape control characters (0x00..0x1F) or, if
                            // ensure_ascii parameter is used, non-ASCII characters
                            if ((codepoint <= 0x1F) or (ensure_ascii and (codepoint >= 0x7F)))
                            {
                                if (codepoint <= 0xFFFF)
                                {
                                    std::snprintf(string_buffer.data() + bytes, 7, "\\u%04x",
                                                  static_cast<uint16_t>(codepoint));
                                    bytes += 6;
                                }
                                else
                                {
                                    std::snprintf(string_buffer.data() + bytes, 13, "\\u%04x\\u%04x",
                                                  static_cast<uint16_t>(0xD7C0 + (codepoint >> 10)),
                                                  static_cast<uint16_t>(0xDC00 + (codepoint & 0x3FF)));
                                    bytes += 12;
                                }
                            }
                            else
                            {
                                // copy byte to buffer (all previous bytes
                                // been copied have in default case above)
                                string_buffer[bytes++] = s[i];
                            }
                            break;
                        }
                    }

                    // write buffer and reset index; there must be 13 bytes
                    // left, as this is the maximal number of bytes to be
                    // written ("\uxxxx\uxxxx\0") for one code point
                    if (string_buffer.size() - bytes < 13)
                    {
                        o->write_characters(string_buffer.data(), bytes);
                        bytes = 0;
                    }
                    break;
                }

                case UTF8_REJECT:  // decode found invalid UTF-8 byte
                {
                    std::string sn(3, '\0');
                    snprintf(&sn[0], sn.size(), "%.2X", byte);
                    JSON_THROW(type_error::create(316, "invalid UTF-8 byte at index " + std::to_string(i) + ": 0x" + sn));
                }

                default:  // decode found yet incomplete multi-byte code point
                {
                    if (not ensure_ascii)
                    {
                        // code point will not be escaped - copy byte to buffer
                        string_buffer[bytes++] = s[i];
                    }
                    break;
                }
            }
        }

        if (JSON_LIKELY(state == UTF8_ACCEPT))
        {
            // write buffer
            if (bytes > 0)
            {
                o->write_characters(string_buffer.data(), bytes);
            }
        }
        else
        {
            // we finish reading, but do not accept: string was incomplete
            std::string sn(3, '\0');
            snprintf(&sn[0], sn.size(), "%.2X", static_cast<uint8_t>(s.back()));
            JSON_THROW(type_error::create(316, "incomplete UTF-8 string; last byte: 0x" + sn));
        }
    }